

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * gl4cts::GLSL420Pack::Utils::getUtf8Character(UTF8_CHARACTERS character)

{
  TestError *this;
  uchar *local_18;
  GLchar *result;
  UTF8_CHARACTERS character_local;
  
  switch(character) {
  case TWO_BYTES:
    local_18 = getUtf8Character::two_bytes;
    break;
  case THREE_BYTES:
    local_18 = getUtf8Character::three_bytes;
    break;
  case FOUR_BYTES:
    local_18 = getUtf8Character::four_bytes;
    break;
  case FIVE_BYTES:
    local_18 = getUtf8Character::five_bytes;
    break;
  case SIX_BYTES:
    local_18 = getUtf8Character::six_bytes;
    break;
  case REDUNDANT_ASCII:
    local_18 = getUtf8Character::redundant_bytes;
    break;
  case EMPTY:
    local_18 = "";
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x535);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return (GLchar *)local_18;
}

Assistant:

const GLchar* Utils::getUtf8Character(Utils::UTF8_CHARACTERS character)
{
	static const unsigned char two_bytes[]		 = { 0xd7, 0x84, 0x00 };
	static const unsigned char three_bytes[]	 = { 0xe3, 0x82, 0x81, 0x00 };
	static const unsigned char four_bytes[]		 = { 0xf0, 0x93, 0x83, 0x93, 0x00 };
	static const unsigned char five_bytes[]		 = { 0xfa, 0x82, 0x82, 0x82, 0x82, 0x00 };
	static const unsigned char six_bytes[]		 = { 0xfd, 0x82, 0x82, 0x82, 0x82, 0x82, 0x00 };
	static const unsigned char redundant_bytes[] = { 0xf2, 0x80, 0x80, 0x5e, 0x00 };

	const GLchar* result = 0;

	switch (character)
	{
	case TWO_BYTES:
		result = (const GLchar*)two_bytes;
		break;
	case THREE_BYTES:
		result = (const GLchar*)three_bytes;
		break;
	case FOUR_BYTES:
		result = (const GLchar*)four_bytes;
		break;
	case FIVE_BYTES:
		result = (const GLchar*)five_bytes;
		break;
	case SIX_BYTES:
		result = (const GLchar*)six_bytes;
		break;
	case REDUNDANT_ASCII:
		result = (const GLchar*)redundant_bytes;
		break;
	case EMPTY:
		result = "";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}